

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_operator_suite.cpp
# Opt level: O0

void addition_suite::add_integer_with_map(void)

{
  size_type in_RCX;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_158;
  error *ex;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_108;
  undefined1 local_a8 [64];
  basic_variable<std::allocator<char>_> local_68;
  undefined1 local_38 [8];
  variable data;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>
            ((basic_variable<std::allocator<char>_> *)local_38,2);
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_const_char_(&)[9],_true>
            (&local_108,(char (*) [6])"alpha",(char (*) [9])"hydrogen");
  local_a8._0_8_ = &local_108;
  local_a8._8_8_ = 1;
  init._M_len = in_RCX;
  init._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_a8 + 0x10),
             (basic_map<std::allocator<char>_> *)local_a8._0_8_,init);
  trial::dynamic::operator+
            (&local_68,(basic_variable<std::allocator<char>_> *)local_38,
             (basic_variable<std::allocator<char>_> *)(local_a8 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_68);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_a8 + 0x10));
  local_158 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
               *)local_a8;
  do {
    local_158 = local_158 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_158);
  } while (local_158 != &local_108);
  trial::protocol::core::detail::throw_failed_impl
            ("data + map::make({{ \"alpha\", \"hydrogen\" }})","error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x9c7,"void addition_suite::add_integer_with_map()");
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38);
  return;
}

Assistant:

void add_integer_with_map()
{
    variable data(2);
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(data + map::make({{ "alpha", "hydrogen" }}),
                                    error,
                                    "incompatible type");
}